

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_hello_message(mg_session *session,mg_message_hello **message)

{
  int iVar1;
  mg_map *in_RAX;
  mg_message_hello *pmVar2;
  mg_map *extra;
  mg_message_hello local_18;
  
  local_18.extra = in_RAX;
  iVar1 = mg_session_read_map(session,&local_18.extra);
  if (iVar1 == 0) {
    pmVar2 = (mg_message_hello *)mg_allocator_malloc(session->decoder_allocator,8);
    if (pmVar2 == (mg_message_hello *)0x0) {
      mg_map_destroy_ca(local_18.extra,session->decoder_allocator);
      iVar1 = -3;
    }
    else {
      pmVar2->extra = local_18.extra;
      *message = pmVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_hello_message(mg_session *session,
                                  mg_message_hello **message) {
  int status = 0;

  mg_map *extra;
  status = mg_session_read_map(session, &extra);
  if (status != 0) {
    return status;
  }

  mg_message_hello *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_hello));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->extra = extra;
  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);
  return status;
}